

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,double frustum_depth,double *scale)

{
  bool bVar1;
  int iVar2;
  ushort uVar3;
  double dVar4;
  double sw;
  double fw;
  double x;
  double s;
  double *scale_local;
  double frustum_depth_local;
  ON_Viewport *this_local;
  
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  if ((this->m_bValidFrustum & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->m_bValidPort & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    x = 1.0;
    s = (double)scale;
    scale_local = (double *)frustum_depth;
    frustum_depth_local = (double)this;
    bVar1 = IsPerspectiveProjection(this);
    if (((bVar1) && (bVar1 = ON_IsValid((double)scale_local), bVar1)) && (0.0 < (double)scale_local)
       ) {
      if (this->m_frus_near <= 0.0) {
        return false;
      }
      dVar4 = (double)scale_local / this->m_frus_near;
      x = dVar4;
      if ((dVar4 < 0.0) &&
         (x._6_2_ = (ushort)((ulong)dVar4 >> 0x30), uVar3 = x._6_2_ & 0x7ff0, uVar3 != 0x7ff0)) {
        return false;
      }
    }
    fw = 1.0;
    GetViewScale(this,&fw,(double *)0x0);
    if (((fw != 0.0) || (NAN(fw))) && ((fw != 1.0 || (NAN(fw))))) {
      x = x / ABS(fw);
    }
    dVar4 = FrustumWidth(this);
    if (0.0 < ABS(dVar4)) {
      dVar4 = x * ABS(dVar4);
      iVar2 = ScreenPortWidth(this);
      if (0.0 < ABS((double)iVar2)) {
        dVar4 = ABS((double)iVar2) / dVar4;
        if ((0.0 < dVar4) ||
           (x._6_2_ = (ushort)((ulong)dVar4 >> 0x30), (x._6_2_ & 0x7ff0) == 0x7ff0)) {
          if (s != 0.0) {
            *(double *)s = dVar4;
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  double frustum_depth,
  double* scale
  ) const
{
  if (nullptr != scale)
    *scale = 0.0;

  if (false == m_bValidFrustum)
    return false;

  if (false == m_bValidPort)
    return false;

  double s = 1.0;

  if (IsPerspectiveProjection() && ON_IsValid(frustum_depth) && frustum_depth > 0.0)
  {
    if (!(m_frus_near > 0.0))
      return false;
    s = frustum_depth / m_frus_near;
    if (!(s >= 0.0) && ON_IS_FINITE(s))
      return false;
  }

  double x = 1.0;
  GetViewScale(&x, nullptr);
  if (x != 0.0 && 1.0 != x)
    s /= fabs(x);

  double fw = fabs(FrustumWidth());
  if (!(fw > 0.0))
    return false;

  fw *= s;

  double sw = fabs((double)ScreenPortWidth());
  if (!(sw > 0.0))
    return false;

  s = sw / fw;
  if (!(s > 0.0) && ON_IS_FINITE(s))
    return false;

  if (nullptr != scale)
    *scale = s;

  return true;
}